

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxcover.cpp
# Opt level: O2

size_t sets_union<320ul,std::array<unsigned_long,5ul>>
                 (vector<std::bitset<320UL>,_std::allocator<std::bitset<320UL>_>_> *binary_sets,
                 array<unsigned_long,_5UL> *c)

{
  pointer pbVar1;
  size_t sVar2;
  long lVar3;
  value_type x;
  _Base_bitset<5UL> local_48;
  
  pbVar1 = (binary_sets->
           super__Vector_base<std::bitset<320UL>,_std::allocator<std::bitset<320UL>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_48._M_w[4] = pbVar1[c->_M_elems[0]].super__Base_bitset<5UL>._M_w[4];
  pbVar1 = pbVar1 + c->_M_elems[0];
  local_48._M_w[0] = (pbVar1->super__Base_bitset<5UL>)._M_w[0];
  local_48._M_w[1] = (pbVar1->super__Base_bitset<5UL>)._M_w[1];
  local_48._M_w[2] = (pbVar1->super__Base_bitset<5UL>)._M_w[2];
  local_48._M_w[3] = (pbVar1->super__Base_bitset<5UL>)._M_w[3];
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    std::_Base_bitset<5UL>::_M_do_or
              (&local_48,
               &(binary_sets->
                super__Vector_base<std::bitset<320UL>,_std::allocator<std::bitset<320UL>_>_>).
                _M_impl.super__Vector_impl_data._M_start[c->_M_elems[lVar3 + 1]].
                super__Base_bitset<5UL>);
  }
  sVar2 = std::_Base_bitset<5UL>::_M_do_count(&local_48);
  return sVar2;
}

Assistant:

size_t sets_union(const std::vector<std::bitset<n_entities>>& binary_sets, const Collection& c)
{
    auto x = binary_sets[c[0]];
    for (size_t i = 1; i < c.size(); ++i)
        x |= binary_sets[c[i]];
    return x.count();
}